

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O3

bool duckdb::TryCastStringBool(char *input_data,idx_t input_size,bool *result,bool strict)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  
  switch(input_size) {
  case 1:
    uVar2 = tolower((int)*input_data);
    uVar2 = uVar2 & 0xff;
    bVar6 = true;
    if (uVar2 < 0x6e) {
      if (uVar2 != 0x30) {
        if (uVar2 == 0x31) break;
        if (uVar2 != 0x66) {
          return false;
        }
      }
    }
    else {
      if ((uVar2 == 0x79) || (uVar2 == 0x74)) break;
      if (uVar2 != 0x6e) {
        return false;
      }
    }
    bVar6 = false;
    break;
  case 2:
    iVar1 = tolower((int)*input_data);
    uVar2 = tolower((int)input_data[1]);
    if ((char)iVar1 != 'n') {
      return false;
    }
    bVar6 = false;
    if ((uVar2 & 0xff) != 0x6f) {
      return false;
    }
    break;
  case 3:
    iVar1 = tolower((int)*input_data);
    uVar2 = tolower((int)input_data[1]);
    uVar3 = tolower((int)input_data[2]);
    if ((char)iVar1 != 'y') {
      return false;
    }
    if ((uVar2 & 0xff) != 0x65) {
      return false;
    }
    bVar6 = true;
    if ((uVar3 & 0xff) != 0x73) {
      return false;
    }
    break;
  case 4:
    iVar1 = tolower((int)*input_data);
    uVar2 = tolower((int)input_data[1]);
    uVar3 = tolower((int)input_data[2]);
    uVar5 = tolower((int)input_data[3]);
    if ((char)iVar1 != 't') {
      return false;
    }
    if ((uVar2 & 0xff) != 0x72) {
      return false;
    }
    if ((uVar3 & 0xff) != 0x75) {
      return false;
    }
    bVar6 = true;
    goto LAB_00d06f80;
  case 5:
    iVar1 = tolower((int)*input_data);
    uVar2 = tolower((int)input_data[1]);
    uVar3 = tolower((int)input_data[2]);
    uVar4 = tolower((int)input_data[3]);
    uVar5 = tolower((int)input_data[4]);
    if ((char)iVar1 != 'f') {
      return false;
    }
    if ((uVar2 & 0xff) != 0x61) {
      return false;
    }
    if ((uVar3 & 0xff) != 0x6c) {
      return false;
    }
    if ((uVar4 & 0xff) != 0x73) {
      return false;
    }
    bVar6 = false;
LAB_00d06f80:
    if ((uVar5 & 0xff) != 0x65) {
      return false;
    }
    break;
  default:
    return false;
  }
  *result = bVar6;
  return true;
}

Assistant:

static inline bool TryCastStringBool(const char *input_data, idx_t input_size, bool &result, bool strict) {
	switch (input_size) {
	case 1: {
		unsigned char c = static_cast<uint8_t>(std::tolower(*input_data));
		if (c == 't' || (!strict && c == 'y') || (!strict && c == '1')) {
			result = true;
			return true;
		} else if (c == 'f' || (!strict && c == 'n') || (!strict && c == '0')) {
			result = false;
			return true;
		}
		return false;
	}
	case 2: {
		unsigned char n = static_cast<uint8_t>(std::tolower(input_data[0]));
		unsigned char o = static_cast<uint8_t>(std::tolower(input_data[1]));
		if (n == 'n' && o == 'o') {
			result = false;
			return true;
		}
		return false;
	}
	case 3: {
		unsigned char y = static_cast<uint8_t>(std::tolower(input_data[0]));
		unsigned char e = static_cast<uint8_t>(std::tolower(input_data[1]));
		unsigned char s = static_cast<uint8_t>(std::tolower(input_data[2]));
		if (y == 'y' && e == 'e' && s == 's') {
			result = true;
			return true;
		}
		return false;
	}
	case 4: {
		unsigned char t = static_cast<uint8_t>(std::tolower(input_data[0]));
		unsigned char r = static_cast<uint8_t>(std::tolower(input_data[1]));
		unsigned char u = static_cast<uint8_t>(std::tolower(input_data[2]));
		unsigned char e = static_cast<uint8_t>(std::tolower(input_data[3]));
		if (t == 't' && r == 'r' && u == 'u' && e == 'e') {
			result = true;
			return true;
		}
		return false;
	}
	case 5: {
		unsigned char f = static_cast<uint8_t>(std::tolower(input_data[0]));
		unsigned char a = static_cast<uint8_t>(std::tolower(input_data[1]));
		unsigned char l = static_cast<uint8_t>(std::tolower(input_data[2]));
		unsigned char s = static_cast<uint8_t>(std::tolower(input_data[3]));
		unsigned char e = static_cast<uint8_t>(std::tolower(input_data[4]));
		if (f == 'f' && a == 'a' && l == 'l' && s == 's' && e == 'e') {
			result = false;
			return true;
		}
		return false;
	}
	default:
		return false;
	}
}